

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O2

void __thiscall
cmCommandArgumentParserHelper::AllocateParserType
          (cmCommandArgumentParserHelper *this,ParserType *pt,char *str,int len)

{
  size_t sVar1;
  char *__dest;
  
  pt->str = (char *)0x0;
  if (len == 0) {
    sVar1 = strlen(str);
    len = (int)sVar1;
    if (len == 0) {
      return;
    }
  }
  __dest = (char *)operator_new__((long)(len + 1));
  pt->str = __dest;
  strncpy(__dest,str,(long)len);
  __dest[len] = '\0';
  std::vector<char_*,_std::allocator<char_*>_>::push_back(&this->Variables,&pt->str);
  return;
}

Assistant:

void cmCommandArgumentParserHelper::AllocateParserType(
  cmCommandArgumentParserHelper::ParserType* pt, const char* str, int len)
{
  pt->str = CM_NULLPTR;
  if (len == 0) {
    len = static_cast<int>(strlen(str));
  }
  if (len == 0) {
    return;
  }
  pt->str = new char[len + 1];
  strncpy(pt->str, str, len);
  pt->str[len] = 0;
  this->Variables.push_back(pt->str);
}